

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

size_t BIT_initDStream(BIT_DStream_t *bitD,void *srcBuffer,size_t srcSize)

{
  byte bVar1;
  size_t sVar2;
  uint local_3c;
  uint local_30;
  BYTE lastByte_1;
  BYTE lastByte;
  size_t srcSize_local;
  void *srcBuffer_local;
  BIT_DStream_t *bitD_local;
  
  if (srcSize == 0) {
    memset(bitD,0,0x28);
    bitD_local = (BIT_DStream_t *)0xffffffffffffffb8;
  }
  else {
    bitD->start = (char *)srcBuffer;
    bitD->limitPtr = bitD->start + 8;
    bitD_local = (BIT_DStream_t *)srcSize;
    if (srcSize < 8) {
      bitD->ptr = bitD->start;
      bitD->bitContainer = (ulong)(byte)*bitD->start;
      switch(srcSize) {
      case 7:
        bitD->bitContainer = ((ulong)*(byte *)((long)srcBuffer + 6) << 0x30) + bitD->bitContainer;
      case 6:
        bitD->bitContainer = ((ulong)*(byte *)((long)srcBuffer + 5) << 0x28) + bitD->bitContainer;
      case 5:
        bitD->bitContainer = ((ulong)*(byte *)((long)srcBuffer + 4) << 0x20) + bitD->bitContainer;
      case 4:
        bitD->bitContainer = (ulong)*(byte *)((long)srcBuffer + 3) * 0x1000000 + bitD->bitContainer;
      case 3:
        bitD->bitContainer = (ulong)*(byte *)((long)srcBuffer + 2) * 0x10000 + bitD->bitContainer;
      case 2:
        bitD->bitContainer = (ulong)*(byte *)((long)srcBuffer + 1) * 0x100 + bitD->bitContainer;
      default:
        bVar1 = *(byte *)((long)srcBuffer + (srcSize - 1));
        if (bVar1 == 0) {
          local_3c = 0;
        }
        else {
          local_3c = BIT_highbit32((uint)bVar1);
          local_3c = 8 - local_3c;
        }
        bitD->bitsConsumed = local_3c;
        if (bVar1 == 0) {
          bitD_local = (BIT_DStream_t *)0xffffffffffffffec;
        }
        else {
          bitD->bitsConsumed = (8 - (int)srcSize) * 8 + bitD->bitsConsumed;
        }
      }
    }
    else {
      bitD->ptr = (char *)((long)srcBuffer + (srcSize - 8));
      sVar2 = MEM_readLEST(bitD->ptr);
      bitD->bitContainer = sVar2;
      bVar1 = *(byte *)((long)srcBuffer + (srcSize - 1));
      if (bVar1 == 0) {
        local_30 = 0;
      }
      else {
        local_30 = BIT_highbit32((uint)bVar1);
        local_30 = 8 - local_30;
      }
      bitD->bitsConsumed = local_30;
      if (bVar1 == 0) {
        bitD_local = (BIT_DStream_t *)0xffffffffffffffff;
      }
    }
  }
  return (size_t)bitD_local;
}

Assistant:

MEM_STATIC size_t BIT_initDStream(BIT_DStream_t* bitD, const void* srcBuffer, size_t srcSize)
{
    if (srcSize < 1) { ZSTD_memset(bitD, 0, sizeof(*bitD)); return ERROR(srcSize_wrong); }

    bitD->start = (const char*)srcBuffer;
    bitD->limitPtr = bitD->start + sizeof(bitD->bitContainer);

    if (srcSize >=  sizeof(bitD->bitContainer)) {  /* normal case */
        bitD->ptr   = (const char*)srcBuffer + srcSize - sizeof(bitD->bitContainer);
        bitD->bitContainer = MEM_readLEST(bitD->ptr);
        { BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
          bitD->bitsConsumed = lastByte ? 8 - BIT_highbit32(lastByte) : 0;  /* ensures bitsConsumed is always set */
          if (lastByte == 0) return ERROR(GENERIC); /* endMark not present */ }
    } else {
        bitD->ptr   = bitD->start;
        bitD->bitContainer = *(const BYTE*)(bitD->start);
        switch(srcSize)
        {
        case 7: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[6]) << (sizeof(bitD->bitContainer)*8 - 16);
                /* fall-through */

        case 6: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[5]) << (sizeof(bitD->bitContainer)*8 - 24);
                /* fall-through */

        case 5: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[4]) << (sizeof(bitD->bitContainer)*8 - 32);
                /* fall-through */

        case 4: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[3]) << 24;
                /* fall-through */

        case 3: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[2]) << 16;
                /* fall-through */

        case 2: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[1]) <<  8;
                /* fall-through */

        default: break;
        }
        {   BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
            bitD->bitsConsumed = lastByte ? 8 - BIT_highbit32(lastByte) : 0;
            if (lastByte == 0) return ERROR(corruption_detected);  /* endMark not present */
        }
        bitD->bitsConsumed += (U32)(sizeof(bitD->bitContainer) - srcSize)*8;
    }

    return srcSize;
}